

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_71de73::HandleScriptMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  bool bVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  string *psVar7;
  cmGlobalGenerator *this;
  pointer pbVar8;
  ulong uVar9;
  int iVar10;
  bool all_components;
  bool exclude_from_all;
  string component;
  string script;
  Helper helper;
  undefined1 local_13a;
  bool local_139;
  cmExecutionStatus *local_138;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_130;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_128;
  undefined1 local_120 [48];
  undefined1 local_f0 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  string local_c0;
  string local_a0;
  undefined1 local_80 [48];
  string local_50;
  
  local_138 = status;
  Helper::Helper((Helper *)local_80,status);
  std::__cxx11::string::string((string *)&local_c0,(string *)(local_80 + 0x10));
  iVar10 = 0;
  local_139 = false;
  local_13a = 0;
  uVar9 = 0;
  while( true ) {
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pbVar1 - (long)pbVar8 >> 5) <= uVar9) break;
    bVar4 = std::operator==(pbVar8 + uVar9,"COMPONENT");
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((bVar4) &&
       (uVar9 + 1 <
        (ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5))) {
      std::__cxx11::string::_M_assign((string *)&local_c0);
      iVar10 = iVar10 + 1;
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar9 = uVar9 + 1;
    }
    bVar4 = std::operator==(pbVar8 + uVar9,"EXCLUDE_FROM_ALL");
    if (bVar4) {
      local_139 = true;
    }
    else {
      bVar4 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar9,"ALL_COMPONENTS");
      if (bVar4) {
        local_13a = 1;
      }
    }
    uVar9 = uVar9 + 1;
  }
  if (iVar10 < 2) {
    if ((local_13a & iVar10 == 1) == 0) {
      local_138 = (cmExecutionStatus *)&local_138->Error;
      bVar4 = false;
      bVar2 = false;
LAB_00239c7d:
      if (pbVar8 == pbVar1) goto LAB_00239f17;
      bVar5 = std::operator==(pbVar8,"SCRIPT");
      if (bVar5) {
        bVar4 = true;
LAB_00239c9b:
        bVar2 = false;
      }
      else {
        bVar5 = std::operator==(pbVar8,"CODE");
        if (bVar5) {
          bVar2 = true;
        }
        else {
          bVar5 = std::operator==(pbVar8,"COMPONENT");
          uVar3 = local_80._8_8_;
          if (!bVar5) {
            if (!bVar4) {
              if (bVar2) {
                local_a0._M_dataplus._M_p._0_1_ = 1;
                cmMakefile::GetBacktrace((cmMakefile *)local_120);
                std::
                make_unique<cmInstallScriptGenerator,std::__cxx11::string_const&,bool,std::__cxx11::string&,bool&,bool&,cmListFileBacktrace>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_f0,(bool *)pbVar8,&local_a0,(bool *)&local_c0,&local_139,
                           (cmListFileBacktrace *)&local_13a);
                local_130._M_head_impl = (cmInstallGenerator *)local_f0._0_8_;
                local_f0._0_8_ = (_Elt_pointer)0x0;
                cmMakefile::AddInstallGenerator
                          ((cmMakefile *)uVar3,
                           (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                            *)&local_130);
                if (local_130._M_head_impl != (cmInstallGenerator *)0x0) {
                  (*(code *)((((_Vector_impl *)
                              &((local_130._M_head_impl)->super_cmScriptGenerator).
                               _vptr_cmScriptGenerator)->super__Vector_impl_data)._M_start)->
                            _M_string_length)();
                }
                local_130._M_head_impl = (cmInstallGenerator *)0x0;
                if ((_Elt_pointer)local_f0._0_8_ != (_Elt_pointer)0x0) {
                  (**(code **)(*(long *)local_f0._0_8_ + 8))();
                }
                local_f0._0_8_ = (_Elt_pointer)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_120 + 8));
                goto LAB_00239c9b;
              }
              goto LAB_00239cd0;
            }
            std::__cxx11::string::string((string *)&local_a0,(string *)pbVar8);
            bVar4 = cmsys::SystemTools::FileIsFullPath(&local_a0);
            if (!bVar4) {
              psVar7 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                                 ((cmMakefile *)local_80._8_8_);
              local_120._8_8_ = (psVar7->_M_dataplus)._M_p;
              local_120._0_8_ = psVar7->_M_string_length;
              local_f0._0_8_ = &DAT_00000001;
              local_f0._8_8_ = &local_e0;
              local_e0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_1_ = '/';
              cmStrCat<std::__cxx11::string>
                        (&local_50,(cmAlphaNum *)local_120,(cmAlphaNum *)local_f0,pbVar8);
              std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_50);
              std::__cxx11::string::~string((string *)&local_50);
            }
            bVar6 = cmsys::SystemTools::FileIsDirectory(&local_a0);
            uVar3 = local_80._8_8_;
            if (bVar6) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_120,"given a directory as value of SCRIPT argument.",
                         (allocator<char> *)local_f0);
              std::__cxx11::string::_M_assign((string *)local_138);
              std::__cxx11::string::~string((string *)local_120);
            }
            else {
              local_50._M_dataplus._M_p._0_1_ = 0;
              cmMakefile::GetBacktrace((cmMakefile *)local_120);
              std::
              make_unique<cmInstallScriptGenerator,std::__cxx11::string&,bool,std::__cxx11::string&,bool&,bool&,cmListFileBacktrace>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f0,(bool *)&local_a0,&local_50,(bool *)&local_c0,&local_139,
                         (cmListFileBacktrace *)&local_13a);
              local_128._M_head_impl = (cmInstallGenerator *)local_f0._0_8_;
              local_f0._0_8_ = (_Elt_pointer)0x0;
              cmMakefile::AddInstallGenerator
                        ((cmMakefile *)uVar3,
                         (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *
                         )&local_128);
              if (local_128._M_head_impl != (cmInstallGenerator *)0x0) {
                (*(code *)((((_Vector_impl *)
                            &((local_128._M_head_impl)->super_cmScriptGenerator).
                             _vptr_cmScriptGenerator)->super__Vector_impl_data)._M_start)->
                          _M_string_length)();
              }
              local_128._M_head_impl = (cmInstallGenerator *)0x0;
              if ((_Elt_pointer)local_f0._0_8_ != (_Elt_pointer)0x0) {
                (**(code **)(*(long *)local_f0._0_8_ + 8))();
              }
              local_f0._0_8_ = (_Elt_pointer)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_120 + 8));
            }
            std::__cxx11::string::~string((string *)&local_a0);
            bVar4 = false;
            bVar5 = false;
            if (bVar6) goto LAB_00239f7a;
            goto LAB_00239cd0;
          }
          bVar2 = false;
        }
        bVar4 = false;
      }
LAB_00239cd0:
      pbVar8 = pbVar8 + 1;
      goto LAB_00239c7d;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_120,"ALL_COMPONENTS and COMPONENT are mutually exclusive",
               (allocator<char> *)local_f0);
    std::__cxx11::string::_M_assign((string *)&local_138->Error);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_120,
               "given more than one COMPONENT for the SCRIPT or CODE signature of the INSTALL command. Use multiple INSTALL commands with one COMPONENT each."
               ,(allocator<char> *)local_f0);
    std::__cxx11::string::_M_assign((string *)&local_138->Error);
  }
LAB_00239f6e:
  std::__cxx11::string::~string((string *)local_120);
  bVar5 = false;
LAB_00239f7a:
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)(local_80 + 0x10));
  return bVar5;
LAB_00239f17:
  if (bVar4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_120,"given no value for SCRIPT argument.",(allocator<char> *)local_f0
              );
    std::__cxx11::string::_M_assign((string *)local_138);
  }
  else {
    if (!bVar2) {
      this = cmMakefile::GetGlobalGenerator((cmMakefile *)local_80._8_8_);
      bVar5 = true;
      cmGlobalGenerator::AddInstallComponent(this,&local_c0);
      goto LAB_00239f7a;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_120,"given no value for CODE argument.",(allocator<char> *)local_f0);
    std::__cxx11::string::_M_assign((string *)local_138);
  }
  goto LAB_00239f6e;
}

Assistant:

bool HandleScriptMode(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  Helper helper(status);

  std::string component = helper.DefaultComponentName;
  int componentCount = 0;
  bool doing_script = false;
  bool doing_code = false;
  bool exclude_from_all = false;
  bool all_components = false;

  // Scan the args once for COMPONENT. Only allow one.
  //
  for (size_t i = 0; i < args.size(); ++i) {
    if (args[i] == "COMPONENT" && i + 1 < args.size()) {
      ++componentCount;
      ++i;
      component = args[i];
    }
    if (args[i] == "EXCLUDE_FROM_ALL") {
      exclude_from_all = true;
    } else if (args[i] == "ALL_COMPONENTS") {
      all_components = true;
    }
  }

  if (componentCount > 1) {
    status.SetError("given more than one COMPONENT for the SCRIPT or CODE "
                    "signature of the INSTALL command. "
                    "Use multiple INSTALL commands with one COMPONENT each.");
    return false;
  }

  if (all_components && componentCount == 1) {
    status.SetError("ALL_COMPONENTS and COMPONENT are mutually exclusive");
    return false;
  }

  // Scan the args again, this time adding install generators each time we
  // encounter a SCRIPT or CODE arg:
  //
  for (std::string const& arg : args) {
    if (arg == "SCRIPT") {
      doing_script = true;
      doing_code = false;
    } else if (arg == "CODE") {
      doing_script = false;
      doing_code = true;
    } else if (arg == "COMPONENT") {
      doing_script = false;
      doing_code = false;
    } else if (doing_script) {
      doing_script = false;
      std::string script = arg;
      if (!cmSystemTools::FileIsFullPath(script)) {
        script =
          cmStrCat(helper.Makefile->GetCurrentSourceDirectory(), '/', arg);
      }
      if (cmSystemTools::FileIsDirectory(script)) {
        status.SetError("given a directory as value of SCRIPT argument.");
        return false;
      }
      helper.Makefile->AddInstallGenerator(
        cm::make_unique<cmInstallScriptGenerator>(
          script, false, component, exclude_from_all, all_components,
          helper.Makefile->GetBacktrace()));
    } else if (doing_code) {
      doing_code = false;
      std::string const& code = arg;
      helper.Makefile->AddInstallGenerator(
        cm::make_unique<cmInstallScriptGenerator>(
          code, true, component, exclude_from_all, all_components,
          helper.Makefile->GetBacktrace()));
    }
  }

  if (doing_script) {
    status.SetError("given no value for SCRIPT argument.");
    return false;
  }
  if (doing_code) {
    status.SetError("given no value for CODE argument.");
    return false;
  }

  // Tell the global generator about any installation component names
  // specified.
  helper.Makefile->GetGlobalGenerator()->AddInstallComponent(component);

  return true;
}